

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::
ExceptionOr(ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
            *this,OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *value)

{
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *t;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *value_local;
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *this_local;
  
  ExceptionOrValue::ExceptionOrValue(&this->super_ExceptionOrValue);
  t = mv<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>(value);
  Maybe<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::Maybe
            (&this->value,t);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}